

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void duckdb::DecimalRoundNegativePrecisionFunction<int,duckdb::NumericHelper>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  int iVar1;
  int iVar2;
  anon_class_24_3_736b1486 fun;
  pointer pEVar3;
  ulong in_RDX;
  DataChunk *in_RDI;
  int addition;
  int multiply_power_of_ten;
  int divide_power_of_ten;
  uint8_t width;
  uint8_t source_scale;
  RoundPrecisionFunctionData *info;
  BoundFunctionExpression *func_expr;
  size_type in_stack_ffffffffffffff18;
  FunctionData *in_stack_ffffffffffffff20;
  Vector *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint uVar4;
  int *in_stack_ffffffffffffff50;
  BaseExpression *in_stack_ffffffffffffff60;
  int local_88;
  int local_84;
  int local_80 [4];
  Value local_70 [70];
  byte local_2a;
  byte local_29;
  RoundPrecisionFunctionData *local_28;
  BoundFunctionExpression *local_20;
  ulong local_18;
  DataChunk *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_20 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_stack_ffffffffffffff60);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator->
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             in_stack_ffffffffffffff20);
  local_28 = FunctionData::Cast<duckdb::RoundPrecisionFunctionData>(in_stack_ffffffffffffff20);
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_ffffffffffffff20);
  local_29 = duckdb::DecimalType::GetScale((LogicalType *)(pEVar3 + 0x38));
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)in_stack_ffffffffffffff20);
  local_2a = duckdb::DecimalType::GetWidth((LogicalType *)(pEVar3 + 0x38));
  iVar1 = local_28->target_scale;
  iVar2 = -((uint)local_2a - (uint)local_29);
  if (iVar1 == iVar2 ||
      SBORROW4(iVar1,iVar2) != (int)(iVar1 + ((uint)local_2a - (uint)local_29)) < 0) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    uVar4 = 0;
    duckdb::Value::INTEGER((int)local_70);
    duckdb::Vector::SetValue(local_18,(Value *)(ulong)uVar4);
    duckdb::Value::~Value(local_70);
  }
  else {
    local_80[0] = UnsafeNumericCast<int,long,void>
                            ((&NumericHelper::POWERS_OF_TEN)
                             [(int)((uint)local_29 - local_28->target_scale)]);
    local_84 = UnsafeNumericCast<int,long,void>
                         ((&NumericHelper::POWERS_OF_TEN)[-local_28->target_scale]);
    local_88 = local_80[0] / 2;
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    DataChunk::size(local_8);
    fun.divide_power_of_ten._0_4_ = in_stack_ffffffffffffff48;
    fun.addition = (int *)local_18;
    fun.divide_power_of_ten._4_4_ = in_stack_ffffffffffffff4c;
    fun.multiply_power_of_ten = in_stack_ffffffffffffff50;
    UnaryExecutor::
    Execute<int,int,duckdb::DecimalRoundNegativePrecisionFunction<int,duckdb::NumericHelper>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(int)_1_>
              (in_stack_ffffffffffffff30,(Vector *)&local_84,(idx_t)local_80,fun,
               (FunctionErrors)((ulong)&local_88 >> 0x38));
  }
  return;
}

Assistant:

static void DecimalRoundNegativePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	auto width = DecimalType::GetWidth(func_expr.children[0]->return_type);
	if (info.target_scale <= -int32_t(width - source_scale)) {
		// scale too big for width
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		result.SetValue(0, Value::INTEGER(0));
		return;
	}
	T divide_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale + source_scale]);
	T multiply_power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[-info.target_scale]);
	T addition = divide_power_of_ten / 2;

	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / divide_power_of_ten * multiply_power_of_ten);
	});
}